

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O3

void __thiscall Propagator::init_compatible(Propagator *this)

{
  pointer paVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  pointer *ppuVar8;
  ulong uVar9;
  long lVar10;
  array<int,_4UL> value;
  
  uVar3 = this->wave_height;
  if (uVar3 != 0) {
    uVar5 = this->wave_width;
    uVar2 = 0;
    uVar7 = uVar5;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar9 = this->patterns_size;
        uVar4 = 0;
        do {
          if (uVar9 == 0) {
            uVar9 = 0;
          }
          else {
            uVar6 = 0;
            do {
              ppuVar8 = (pointer *)
                        ((long)&(this->propagator_state).
                                super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_elems[3].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl + 8);
              lVar10 = 0;
              do {
                value._M_elems[lVar10] =
                     (int)((ulong)((long)*ppuVar8 -
                                  (long)((_Vector_impl_data *)(ppuVar8 + -1))->_M_start) >> 2);
                lVar10 = lVar10 + 1;
                ppuVar8 = ppuVar8 + -3;
              } while (lVar10 != 4);
              paVar1 = (this->compatible).data.
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       ((this->compatible).width * uVar2 + uVar4) * (this->compatible).depth + uVar6
              ;
              *(undefined8 *)paVar1->_M_elems = value._M_elems._0_8_;
              *(undefined8 *)(paVar1->_M_elems + 2) = value._M_elems._8_8_;
              uVar6 = (ulong)((int)uVar6 + 1);
              uVar9 = this->patterns_size;
            } while (uVar6 < uVar9);
            uVar5 = this->wave_width;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar5);
        uVar3 = this->wave_height;
        uVar7 = uVar5;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar3);
  }
  return;
}

Assistant:

void Propagator::init_compatible() noexcept {
  std::array<int, 4> value;
  // We compute the number of pattern compatible in all directions.
  for (unsigned y = 0; y < wave_height; y++) {
    for (unsigned x = 0; x < wave_width; x++) {
      for (unsigned pattern = 0; pattern < patterns_size; pattern++) {
        for (int direction = 0; direction < 4; direction++) {
          value[direction] =
            static_cast<unsigned>(propagator_state[pattern][get_opposite_direction(direction)]
                                  .size());
        }
        compatible.get(y, x, pattern) = value;
      }
    }
  }
}